

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_pool.cpp
# Opt level: O1

EvictionResult * __thiscall
duckdb::BufferPool::EvictBlocksInternal
          (EvictionResult *__return_storage_ptr__,BufferPool *this,EvictionQueue *queue,
          MemoryTag tag,idx_t extra_memory,idx_t memory_limit,
          unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>,_true> *buffer)

{
  int *piVar1;
  BufferEvictionNode *item;
  _Head_base<0UL,_duckdb::FileBuffer_*,_false> _Var2;
  BufferEvictionNode *this_00;
  undefined8 uVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  BlockHandle *pBVar8;
  type this_01;
  pointer pFVar9;
  ulong uVar10;
  ulong uVar11;
  BufferEvictionNode *lock;
  shared_ptr<duckdb::BlockHandle,_true> handle;
  BufferEvictionNode node;
  TempBufferPoolReservation local_98;
  EvictionResult *local_80;
  undefined1 local_78 [48];
  BufferEvictionNode local_48;
  
  local_98.super_BufferPoolReservation.size = 0;
  local_98.super_BufferPoolReservation.tag = tag;
  local_98.super_BufferPoolReservation.pool = this;
  MemoryUsage::UpdateUsedMemory(&this->memory_usage,tag,extra_memory);
  uVar10 = (this->memory_usage).memory_usage._M_elems[0xe].super___atomic_base<long>._M_i;
  uVar11 = 0;
  if (0 < (long)uVar10) {
    uVar11 = uVar10;
  }
  local_98.super_BufferPoolReservation.size = extra_memory;
  local_78._24_8_ = memory_limit;
  if (memory_limit < uVar11) {
    item = (BufferEvictionNode *)(local_78 + 0x30);
    this_00 = (BufferEvictionNode *)(local_78 + 0x20);
    bVar6 = false;
    local_80 = __return_storage_ptr__;
    do {
      local_48.handle.internal.super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      local_48.handle.internal.super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      bVar4 = duckdb_moodycamel::
              ConcurrentQueue<duckdb::BufferEvictionNode,_duckdb_moodycamel::ConcurrentQueueDefaultTraits>
              ::try_dequeue<duckdb::BufferEvictionNode>(&queue->q,item);
      if (bVar4) {
LAB_01706c93:
        lock = item;
        BufferEvictionNode::TryGetBlockHandle(this_00);
        if (local_78._32_8_ == 0) {
          LOCK();
          (queue->total_dead_nodes).super___atomic_base<unsigned_long>._M_i =
               (queue->total_dead_nodes).super___atomic_base<unsigned_long>._M_i - 1;
          UNLOCK();
          bVar4 = false;
        }
        else {
          pBVar8 = shared_ptr<duckdb::BlockHandle,_true>::operator->
                             ((shared_ptr<duckdb::BlockHandle,_true> *)this_00);
          local_78._8_8_ = &pBVar8->lock;
          local_78[0x10] = 0;
          ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)(local_78 + 8));
          local_78[0x10] = 1;
          this_01 = shared_ptr<duckdb::BlockHandle,_true>::operator*
                              ((shared_ptr<duckdb::BlockHandle,_true> *)this_00);
          if ((local_48.handle_sequence_number ==
               (this_01->eviction_seq_num).super___atomic_base<unsigned_long>._M_i) &&
             (bVar4 = BlockHandle::CanUnload(this_01), bVar4)) {
            if (buffer != (unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>,_true>
                           *)0x0) {
              pBVar8 = shared_ptr<duckdb::BlockHandle,_true>::operator->
                                 ((shared_ptr<duckdb::BlockHandle,_true> *)this_00);
              pFVar9 = unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>,_true>
                       ::operator->(&pBVar8->buffer);
              if (pFVar9->internal_size == extra_memory) {
                pBVar8 = shared_ptr<duckdb::BlockHandle,_true>::operator->
                                   ((shared_ptr<duckdb::BlockHandle,_true> *)this_00);
                BlockHandle::UnloadAndTakeBlock((BlockHandle *)local_78,(BlockLock *)pBVar8);
                uVar3 = local_78._0_8_;
                local_78._0_8_ = (element_type *)0x0;
                _Var2._M_head_impl =
                     (buffer->
                     super_unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>)
                     ._M_t.
                     super___uniq_ptr_impl<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_duckdb::FileBuffer_*,_std::default_delete<duckdb::FileBuffer>_>
                     .super__Head_base<0UL,_duckdb::FileBuffer_*,_false>._M_head_impl;
                (buffer->
                super_unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>)._M_t
                .super___uniq_ptr_impl<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>
                ._M_t.
                super__Tuple_impl<0UL,_duckdb::FileBuffer_*,_std::default_delete<duckdb::FileBuffer>_>
                .super__Head_base<0UL,_duckdb::FileBuffer_*,_false>._M_head_impl =
                     (FileBuffer *)uVar3;
                if (_Var2._M_head_impl != (FileBuffer *)0x0) {
                  (**(code **)((long)(_Var2._M_head_impl)->_vptr_FileBuffer + 8))();
                }
                bVar6 = true;
                bVar4 = true;
                goto LAB_01706d75;
              }
            }
            pBVar8 = shared_ptr<duckdb::BlockHandle,_true>::operator->
                               ((shared_ptr<duckdb::BlockHandle,_true> *)this_00);
            BlockHandle::Unload(pBVar8,(BlockLock *)lock);
            uVar10 = (this->memory_usage).memory_usage._M_elems[0xe].super___atomic_base<long>._M_i;
            if ((long)uVar10 < 1) {
              uVar10 = 0;
            }
            bVar4 = uVar10 <= (ulong)local_78._24_8_;
            if (uVar10 <= (ulong)local_78._24_8_) {
              bVar6 = true;
            }
          }
          else {
            LOCK();
            (queue->total_dead_nodes).super___atomic_base<unsigned_long>._M_i =
                 (queue->total_dead_nodes).super___atomic_base<unsigned_long>._M_i - 1;
            UNLOCK();
            bVar4 = false;
          }
LAB_01706d75:
          ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)(local_78 + 8));
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._40_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._40_8_);
        }
      }
      else {
        bVar5 = EvictionQueue::TryDequeueWithLock(queue,item);
        bVar4 = true;
        if (bVar5) goto LAB_01706c93;
      }
      if (local_48.handle.internal.super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          piVar1 = (int *)((long)&(local_48.handle.internal.
                                   super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi)->_M_use_count + 4);
          iVar7 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
        }
        else {
          iVar7 = *(int *)((long)&(local_48.handle.internal.
                                   super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi)->_M_use_count + 4);
          *(int *)((long)&(local_48.handle.internal.
                           super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi)->_M_use_count + 4) = iVar7 + -1;
        }
        if (iVar7 == 1) {
          (*(code *)((__pthread_internal_list *)
                    (local_48.handle.internal.
                     super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi)->_vptr__Sp_counted_base)[1].__next)();
        }
      }
    } while (!bVar4);
    if (bVar6) {
      bVar4 = Allocator::SupportsFlush();
      __return_storage_ptr__ = local_80;
      if ((bVar4) &&
         ((this->allocator_bulk_deallocation_flush_threshold).super___atomic_base<unsigned_long>.
          _M_i < extra_memory)) {
        Allocator::FlushAll();
      }
    }
    else {
      MemoryUsage::UpdateUsedMemory
                (&(local_98.super_BufferPoolReservation.pool)->memory_usage,
                 local_98.super_BufferPoolReservation.tag,-local_98.super_BufferPoolReservation.size
                );
      local_98.super_BufferPoolReservation.size = 0;
      __return_storage_ptr__ = local_80;
    }
    __return_storage_ptr__->success = bVar6;
  }
  else {
    bVar6 = Allocator::SupportsFlush();
    if ((bVar6) &&
       ((this->allocator_bulk_deallocation_flush_threshold).super___atomic_base<unsigned_long>._M_i
        < extra_memory)) {
      Allocator::FlushAll();
    }
    __return_storage_ptr__->success = true;
  }
  (__return_storage_ptr__->reservation).super_BufferPoolReservation.tag =
       local_98.super_BufferPoolReservation.tag;
  (__return_storage_ptr__->reservation).super_BufferPoolReservation.size = 0;
  (__return_storage_ptr__->reservation).super_BufferPoolReservation.pool =
       local_98.super_BufferPoolReservation.pool;
  (__return_storage_ptr__->reservation).super_BufferPoolReservation.size =
       local_98.super_BufferPoolReservation.size;
  local_98.super_BufferPoolReservation.size = 0;
  TempBufferPoolReservation::~TempBufferPoolReservation(&local_98);
  return __return_storage_ptr__;
}

Assistant:

BufferPool::EvictionResult BufferPool::EvictBlocksInternal(EvictionQueue &queue, MemoryTag tag, idx_t extra_memory,
                                                           idx_t memory_limit, unique_ptr<FileBuffer> *buffer) {
	TempBufferPoolReservation r(tag, *this, extra_memory);
	bool found = false;

	if (memory_usage.GetUsedMemory(MemoryUsageCaches::NO_FLUSH) <= memory_limit) {
		if (Allocator::SupportsFlush() && extra_memory > allocator_bulk_deallocation_flush_threshold) {
			Allocator::FlushAll();
		}
		return {true, std::move(r)};
	}

	queue.IterateUnloadableBlocks([&](BufferEvictionNode &, const shared_ptr<BlockHandle> &handle, BlockLock &lock) {
		// hooray, we can unload the block
		if (buffer && handle->GetBuffer(lock)->AllocSize() == extra_memory) {
			// we can re-use the memory directly
			*buffer = handle->UnloadAndTakeBlock(lock);
			found = true;
			return false;
		}

		// release the memory and mark the block as unloaded
		handle->Unload(lock);

		if (memory_usage.GetUsedMemory(MemoryUsageCaches::NO_FLUSH) <= memory_limit) {
			found = true;
			return false;
		}

		// Continue iteration
		return true;
	});

	if (!found) {
		r.Resize(0);
	} else if (Allocator::SupportsFlush() && extra_memory > allocator_bulk_deallocation_flush_threshold) {
		Allocator::FlushAll();
	}

	return {found, std::move(r)};
}